

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O2

string * __thiscall
FastPForLib::VarIntG8IU::name_abi_cxx11_(string *__return_storage_ptr__,VarIntG8IU *this)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"VarIntG8IU",&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const { return std::string("VarIntG8IU"); }